

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode Array_encodeBinary(void *src,size_t length,UA_DataType *type)

{
  code *pcVar1;
  UA_Byte *pUVar2;
  int iVar3;
  UA_StatusCode UVar4;
  ulong uVar5;
  ulong uVar6;
  size_t finished;
  long lVar7;
  size_t i;
  size_t sVar8;
  
  UVar4 = 0x80020000;
  if ((length < 0x80000000) && (UVar4 = 0x80080000, pos + 4 <= end)) {
    iVar3 = -(uint)(src != (void *)0x1);
    if (length != 0) {
      iVar3 = (int)length;
    }
    *(int *)pos = iVar3;
    pos = pos + 4;
    if (length != 0) {
      if ((type->field_0x25 & 4) == 0) {
        uVar5 = 0x19;
        if ((type->field_0x25 & 1) != 0) {
          uVar5 = (ulong)type->typeIndex;
        }
        pcVar1 = (code *)(&encodeBinaryJumpTable)[uVar5];
        uVar5 = 0;
        do {
          pUVar2 = pos;
          UVar4 = (*pcVar1)(src,type);
          src = (void *)((ulong)type->memSize + (long)src);
          if (UVar4 != 0) {
            if (UVar4 == 0x80080000) {
              pos = pUVar2;
              UVar4 = exchangeBuffer();
              src = (void *)((long)src - (ulong)type->memSize);
              uVar5 = uVar5 - 1;
            }
            if (UVar4 != 0) {
              return UVar4;
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < length);
      }
      else {
        uVar5 = (ulong)type->memSize;
        lVar7 = 0;
        while (sVar8 = (length - lVar7) * uVar5, end < pos + sVar8) {
          uVar6 = (ulong)((long)end - (long)pos) / uVar5;
          sVar8 = uVar6 * uVar5;
          memcpy(pos,src,sVar8);
          pos = pos + sVar8;
          src = (void *)((long)src + sVar8);
          lVar7 = lVar7 + uVar6;
          UVar4 = exchangeBuffer();
          if (UVar4 != 0) {
            return UVar4;
          }
        }
        memcpy(pos,src,sVar8);
        pos = pos + sVar8;
      }
    }
    UVar4 = 0;
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
Array_encodeBinary(const void *src, size_t length, const UA_DataType *type) {
    /* Check and convert the array length to int32 */
    UA_Int32 signed_length = -1;
    if(length > UA_INT32_MAX)
        return UA_STATUSCODE_BADINTERNALERROR;
    if(length > 0)
        signed_length = (UA_Int32)length;
    else if(src == UA_EMPTY_ARRAY_SENTINEL)
        signed_length = 0;

    /* Encode the array length */
    UA_StatusCode retval = Int32_encodeBinary(&signed_length);
    if(retval != UA_STATUSCODE_GOOD || length == 0)
        return retval;

    /* Encode the content */
    if(!type->overlayable)
        return Array_encodeBinaryComplex((uintptr_t)src, length, type);
    return Array_encodeBinaryOverlayable((uintptr_t)src, length, type->memSize);
}